

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

bool IsActorAnItem(AActor *mo)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar4;
  PClass *pPVar3;
  
  pPVar1 = AInventory::RegistrationInfo.MyClass;
  pPVar3 = (mo->super_DThinker).super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(mo->super_DThinker).super_DObject._vptr_DObject)(mo);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (mo->super_DThinker).super_DObject.Class = pPVar3;
  }
  bVar4 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar1 && bVar4) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar4 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar1) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (bVar4) {
    bVar4 = (bool)((byte)(mo->flags).Value & 1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool IsActorAnItem(AActor *mo)
{
	return mo->IsKindOf(RUNTIME_CLASS(AInventory)) && mo->flags&MF_SPECIAL;
}